

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O0

void Mvc_CoverDivideInternal
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  int iVar1;
  int iVar2;
  Mvc_Cube_t *pMVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mvc_Cover_t *pCover_00;
  Mvc_Cover_t *pCover_01;
  undefined4 *__ptr;
  Mvc_Cube_t *pMVar7;
  bool bVar8;
  Mvc_List_t *pList_3;
  int _i__1;
  Mvc_List_t *pList_2;
  Mvc_List_t *pList_1;
  Mvc_List_t *pList;
  int _i_;
  int nCubes;
  int RetValue;
  int c;
  int g;
  int GroupSize;
  int fSkipG;
  int iMerge;
  int iCubeD;
  int iCubeC;
  int nMerges;
  int nCubesD;
  int nCubesC;
  int nGroups;
  int *pGroups;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube1;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCubeD;
  Mvc_Cube_t *pCubeC;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t **ppRem_local;
  Mvc_Cover_t **ppQuo_local;
  Mvc_Cover_t *pDiv_local;
  Mvc_Cover_t *pCover_local;
  
  GroupSize = -1;
  iVar4 = Mvc_CoverReadCubeNum(pDiv);
  iVar5 = Mvc_CoverReadCubeNum(pCover);
  if (iVar4 == 1) {
    iVar4 = Mvc_CoverIsOneLiteral(pDiv);
    if (iVar4 == 0) {
      Mvc_CoverDivideByCube(pCover,pDiv,ppQuo,ppRem);
    }
    else {
      Mvc_CoverDivideByLiteral(pCover,pDiv,ppQuo,ppRem);
    }
  }
  else {
    pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
    pCover_01 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
    Mvc_CoverAllocateMask(pDiv);
    Mvc_CoverSupport(pDiv,pDiv->pMask);
    Mvc_CoverSort(pDiv,(Mvc_Cube_t *)0x0,Mvc_CubeCompareInt);
    Mvc_CoverSort(pCover,pDiv->pMask,Mvc_CubeCompareIntOutsideAndUnderMask);
    __ptr = (undefined4 *)malloc((long)(iVar5 + 1) << 2);
    Mvc_CoverList2Array(pCover);
    Mvc_CoverList2Array(pDiv);
    *__ptr = 0;
    nCubesD = 1;
    for (nCubes = 1; nCubes < iVar5; nCubes = nCubes + 1) {
      pMVar7 = pCover->pCubes[nCubes + -1];
      pMVar3 = pCover->pCubes[nCubes];
      if ((*(uint *)&pMVar7->field_0x8 & 0xffffff) == 0) {
        bVar8 = (pMVar7->pData[0] | pDiv->pMask->pData[0]) ==
                (pMVar3->pData[0] | pDiv->pMask->pData[0]);
      }
      else if ((*(uint *)&pMVar7->field_0x8 & 0xffffff) == 1) {
        bVar8 = false;
        if ((pMVar7->pData[0] | pDiv->pMask->pData[0]) == (pMVar3->pData[0] | pDiv->pMask->pData[0])
           ) {
          bVar8 = (*(uint *)&pMVar7->field_0x14 | *(uint *)&pDiv->pMask->field_0x14) ==
                  (*(uint *)&pMVar3->field_0x14 | *(uint *)&pDiv->pMask->field_0x14);
        }
      }
      else {
        bVar8 = true;
        for (pList._0_4_ = *(uint *)&pMVar7->field_0x8 & 0xffffff; -1 < (int)(uint)pList;
            pList._0_4_ = (uint)pList - 1) {
          if ((pMVar7->pData[(int)(uint)pList] | pDiv->pMask->pData[(int)(uint)pList]) !=
              (pMVar3->pData[(int)(uint)pList] | pDiv->pMask->pData[(int)(uint)pList])) {
            bVar8 = false;
            break;
          }
        }
      }
      if (!bVar8) {
        __ptr[nCubesD] = nCubes;
        nCubesD = nCubesD + 1;
      }
    }
    __ptr[nCubesD] = iVar5;
    pList._4_4_ = 0;
    for (RetValue = 0; RetValue < nCubesD; RetValue = RetValue + 1) {
      iVar1 = __ptr[RetValue + 1];
      iVar2 = __ptr[RetValue];
      if (iVar1 - iVar2 < iVar4) {
        for (nCubes = __ptr[RetValue]; nCubes < (int)__ptr[RetValue + 1]; nCubes = nCubes + 1) {
          pMVar7 = Mvc_CubeDup(pCover_01,pCover->pCubes[nCubes]);
          if ((pCover_01->lCubes).pHead == (Mvc_Cube_t *)0x0) {
            (pCover_01->lCubes).pHead = pMVar7;
          }
          else {
            ((pCover_01->lCubes).pTail)->pNext = pMVar7;
          }
          (pCover_01->lCubes).pTail = pMVar7;
          pMVar7->pNext = (Mvc_Cube_t *)0x0;
          (pCover_01->lCubes).nItems = (pCover_01->lCubes).nItems + 1;
          pList._4_4_ = pList._4_4_ + 1;
        }
      }
      else {
        for (nCubes = __ptr[RetValue]; nCubes < (int)__ptr[RetValue + 1]; nCubes = nCubes + 1) {
          pCover->pCubes[nCubes]->nOnes = 1;
        }
        pCubeCopy = *pDiv->pCubes;
        pCubeD = pCover->pCubes[(int)__ptr[RetValue]];
        bVar8 = false;
        iCubeD = 0;
        fSkipG = 1;
        iMerge = 1;
        while( true ) {
          while (iVar6 = Mvc_CubeCompareIntUnderMask(pCubeD,pCubeCopy,pDiv->pMask), iVar6 != -1) {
            if (iVar6 == 1) {
              bVar8 = true;
              goto LAB_004fc347;
            }
            pCubeD->nOnes = 0;
            GroupSize = iMerge + -1;
            iCubeD = iCubeD + 1;
            if (fSkipG == iVar4) goto LAB_004fc347;
            if (iVar4 <= fSkipG) {
              __assert_fail("iCubeD < nCubesD",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                            ,0xcf,
                            "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                           );
            }
            pCubeCopy = pDiv->pCubes[fSkipG];
            if (iVar5 <= __ptr[RetValue] + iMerge) {
              __assert_fail("pGroups[g]+iCubeC < nCubesC",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                            ,0xd3,
                            "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                           );
            }
            pCubeD = pCover->pCubes[__ptr[RetValue] + iMerge];
            fSkipG = fSkipG + 1;
            iMerge = iMerge + 1;
          }
          if ((iVar1 - iVar2) - iMerge < iVar4 - iCubeD) break;
          pCubeD = pCover->pCubes[__ptr[RetValue] + iMerge];
          iMerge = iMerge + 1;
        }
        bVar8 = true;
LAB_004fc347:
        if (bVar8) {
          for (nCubes = __ptr[RetValue]; nCubes < (int)__ptr[RetValue + 1]; nCubes = nCubes + 1) {
            pMVar7 = Mvc_CubeDup(pCover_01,pCover->pCubes[nCubes]);
            if ((pCover_01->lCubes).pHead == (Mvc_Cube_t *)0x0) {
              (pCover_01->lCubes).pHead = pMVar7;
            }
            else {
              ((pCover_01->lCubes).pTail)->pNext = pMVar7;
            }
            (pCover_01->lCubes).pTail = pMVar7;
            pMVar7->pNext = (Mvc_Cube_t *)0x0;
            (pCover_01->lCubes).nItems = (pCover_01->lCubes).nItems + 1;
            pList._4_4_ = pList._4_4_ + 1;
          }
        }
        else {
          for (nCubes = __ptr[RetValue]; nCubes < (int)__ptr[RetValue + 1]; nCubes = nCubes + 1) {
            if (pCover->pCubes[nCubes]->nOnes != 0) {
              pMVar7 = Mvc_CubeDup(pCover_01,pCover->pCubes[nCubes]);
              if ((pCover_01->lCubes).pHead == (Mvc_Cube_t *)0x0) {
                (pCover_01->lCubes).pHead = pMVar7;
              }
              else {
                ((pCover_01->lCubes).pTail)->pNext = pMVar7;
              }
              (pCover_01->lCubes).pTail = pMVar7;
              pMVar7->pNext = (Mvc_Cube_t *)0x0;
              (pCover_01->lCubes).nItems = (pCover_01->lCubes).nItems + 1;
              pList._4_4_ = pList._4_4_ + 1;
            }
          }
          pMVar7 = Mvc_CubeAlloc(pCover_00);
          if ((*(uint *)&pCover->pCubes[__ptr[RetValue] + GroupSize]->field_0x8 & 0xffffff) == 0) {
            pMVar7->pData[0] =
                 pCover->pCubes[__ptr[RetValue] + GroupSize]->pData[0] &
                 (pDiv->pMask->pData[0] ^ 0xffffffff);
          }
          else if ((*(uint *)&pCover->pCubes[__ptr[RetValue] + GroupSize]->field_0x8 & 0xffffff) ==
                   1) {
            pMVar7->pData[0] =
                 pCover->pCubes[__ptr[RetValue] + GroupSize]->pData[0] &
                 (pDiv->pMask->pData[0] ^ 0xffffffff);
            *(uint *)&pMVar7->field_0x14 =
                 *(uint *)&pCover->pCubes[__ptr[RetValue] + GroupSize]->field_0x14 &
                 (*(uint *)&pDiv->pMask->field_0x14 ^ 0xffffffff);
          }
          else {
            for (pList_3._4_4_ =
                      *(uint *)&pCover->pCubes[__ptr[RetValue] + GroupSize]->field_0x8 & 0xffffff;
                -1 < (int)pList_3._4_4_; pList_3._4_4_ = pList_3._4_4_ - 1) {
              pMVar7->pData[(int)pList_3._4_4_] =
                   pCover->pCubes[__ptr[RetValue] + GroupSize]->pData[(int)pList_3._4_4_] &
                   (pDiv->pMask->pData[(int)pList_3._4_4_] ^ 0xffffffff);
            }
          }
          if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
            (pCover_00->lCubes).pHead = pMVar7;
          }
          else {
            ((pCover_00->lCubes).pTail)->pNext = pMVar7;
          }
          (pCover_00->lCubes).pTail = pMVar7;
          pMVar7->pNext = (Mvc_Cube_t *)0x0;
          (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
          pList._4_4_ = iVar4 + pList._4_4_;
        }
      }
    }
    if (pList._4_4_ != iVar5) {
      __assert_fail("nCubes == nCubesC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivide.c"
                    ,0xf6,
                    "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                   );
    }
    if ((__ptr != (undefined4 *)0x0) && (__ptr != (undefined4 *)0x0)) {
      free(__ptr);
    }
    *ppRem = pCover_01;
    *ppQuo = pCover_00;
  }
  return;
}

Assistant:

void Mvc_CoverDivideInternal( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeD, * pCubeCopy;
    Mvc_Cube_t * pCube1, * pCube2;
    int * pGroups, nGroups;    // the cube groups
    int nCubesC, nCubesD, nMerges, iCubeC, iCubeD;
    int iMerge = -1; // Suppress "might be used uninitialized"
    int fSkipG, GroupSize, g, c, RetValue;
    int nCubes;

    // get cover sizes
    nCubesD = Mvc_CoverReadCubeNum( pDiv );
    nCubesC = Mvc_CoverReadCubeNum( pCover );

    // check trivial cases
    if ( nCubesD == 1 )
    {
        if ( Mvc_CoverIsOneLiteral( pDiv ) )
            Mvc_CoverDivideByLiteral( pCover, pDiv, ppQuo, ppRem );
        else
            Mvc_CoverDivideByCube( pCover, pDiv, ppQuo, ppRem );
        return;
    }

    // create the divisor and the remainder 
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the support of the divisor
    Mvc_CoverAllocateMask( pDiv );
    Mvc_CoverSupport( pDiv, pDiv->pMask );

    // sort the cubes of the divisor
    Mvc_CoverSort( pDiv, NULL, Mvc_CubeCompareInt );
    // sort the cubes of the cover
    Mvc_CoverSort( pCover, pDiv->pMask, Mvc_CubeCompareIntOutsideAndUnderMask );

    // allocate storage for cube groups
    pGroups = MEM_ALLOC( pCover->pMem, int, nCubesC + 1 );

    // mask contains variables in the support of Div
    // split the cubes into groups using the mask
    Mvc_CoverList2Array( pCover );
    Mvc_CoverList2Array( pDiv );
    pGroups[0] = 0;
    nGroups    = 1;
    for ( c = 1; c < nCubesC; c++ )
    {
        // get the cubes
        pCube1 = pCover->pCubes[c-1];
        pCube2 = pCover->pCubes[c  ];
        // compare the cubes
        Mvc_CubeBitEqualOutsideMask( RetValue, pCube1, pCube2, pDiv->pMask );
        if ( !RetValue )
            pGroups[nGroups++] = c;
    }
    // finish off the last group
    pGroups[nGroups] = nCubesC;

    // consider each group separately and decide
    // whether it can produce a quotient cube
    nCubes = 0;
    for ( g = 0; g < nGroups; g++ )
    {
        // if the group has less than nCubesD cubes, 
        // there is no way it can produce the quotient cube
        // copy the cubes to the remainder
        GroupSize = pGroups[g+1] - pGroups[g];
        if ( GroupSize < nCubesD )
        {
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // mark the cubes as those that should be added to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            Mvc_CubeSetSize( pCover->pCubes[c], 1 );

        // go through the cubes in the group and at the same time
        // go through the cubes in the divisor
        iCubeD  = 0;
        iCubeC  = 0;
        pCubeD  = pDiv->pCubes[iCubeD++];
        pCubeC  = pCover->pCubes[pGroups[g]+iCubeC++];
        fSkipG  = 0;
        nMerges = 0;

        while ( 1 )
        {
            // compare the topmost cubes in F and in D
            RetValue = Mvc_CubeCompareIntUnderMask( pCubeC, pCubeD, pDiv->pMask );
            // cube are ordered in increasing order of their int value
            if ( RetValue == -1 ) // pCubeC is above pCubeD
            {  // cube in C should be added to the remainder
                // check that there is enough cubes in the group
                if ( GroupSize - iCubeC < nCubesD - nMerges )
                {
                    fSkipG = 1;
                    break;
                }
                // get the next cube in the cover
                pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
                continue;
            }
            if ( RetValue == 1 ) // pCubeD is above pCubeC
            { // given cube in D does not have a corresponding cube in the cover
                fSkipG = 1;
                break;
            }
            // mark the cube as the one that should NOT be added to the remainder
            Mvc_CubeSetSize( pCubeC, 0 );
            // remember this merged cube
            iMerge = iCubeC-1;
            nMerges++;

            // stop if we considered the last cube of the group
            if ( iCubeD == nCubesD )
                break;

            // advance the cube of the divisor
            assert( iCubeD < nCubesD );
            pCubeD = pDiv->pCubes[iCubeD++];

            // advance the cube of the group
            assert( pGroups[g]+iCubeC < nCubesC );
            pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
        }

        if ( fSkipG )
        { 
            // the group has failed, add all the cubes to the remainder
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // the group has worked, add left-over cubes to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
        {
            pCubeC = pCover->pCubes[c];
            if ( Mvc_CubeReadSize(pCubeC) )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCubeC );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
        }

        // create the quotient cube
        pCube1 = Mvc_CubeAlloc( pQuo );
        Mvc_CubeBitSharp( pCube1, pCover->pCubes[pGroups[g]+iMerge], pDiv->pMask );
        // add the cube to the quotient
        Mvc_CoverAddCubeTail( pQuo, pCube1 );
        nCubes += nCubesD;
    }
    assert( nCubes == nCubesC );

    // deallocate the memory
    MEM_FREE( pCover->pMem, int, nCubesC + 1, pGroups );

    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
//    Mvc_CoverVerifyDivision( pCover, pDiv, pQuo, pRem );
}